

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ostream * operator<<(ostream *out,nodekind *n)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)(*(code *)(&DAT_0010d068 + *(int *)(&DAT_0010d068 + (ulong)*n * 4)))();
  return poVar1;
}

Assistant:

ostream &operator<<(ostream &out, const nodekind &n) {
    switch (n) {
        case PROG:
            return (out << "Program");
        case FUNC:
            return (out << "Function");
        case RETURN:
            return (out << "Return");
        case FOR:
            return (out << "For");
        case IF:
            return (out << "If");
        case WHILE:
            return (out << "While");
        case CONST:
            return (out << "Const");
        case EXPRESSION:
            return (out << "Expression");
        case VAR:
            return (out << "Var");
        case SET:
            return (out << "Set");
        case COMPL:
            return (out << "Comp op: \"<\"");
        case COMPR:
            return (out << "Comp op: \">\"");
        case ADD:
            return (out << "Add");
        case SUB:
            return (out << "Sub");
        case EMPTY:
            return (out << "Empty");
        case SEQ:
            return (out << "Statement");
        case MUL:
            return (out << "Multiplication");
        case DIV:
            return (out << "Division");
        case UN_OP_EXPR_N:
            return (out << "Negation: op: \"-\"");
        case UN_OP_EXPR_L_N:
            return (out << "Negation: op: \"!\"");
        case ELSE:
            return (out << "Else");
        case INT_DECL:
            return (out << "Int declaration");
        case DOUBLE_DECL:
            return (out << "Double declaration");
        case FLOAT_DECL:
            return (out << "Float declaration");
        case CHAR_DECL:
            return (out << "Char declaration");
        case ASSIGNMENT:
            return (out << "Assignment");
        case FUNC_CALL:
            return (out << "Call");
    }
}